

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension,FlatAllocator *alloc)

{
  char cVar1;
  int iVar2;
  MaybeInitializedPtr *pMVar3;
  MaybeInitializedPtr MVar4;
  TaggedStringPtr this_00;
  _func_int **pp_Var5;
  ushort *puVar6;
  double dVar7;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool bVar10;
  byte extraout_AL;
  byte bVar11;
  int32_t iVar12;
  int iVar13;
  undefined8 *puVar14;
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var15;
  long *plVar16;
  string *psVar18;
  Nonnull<const_char_*> pcVar19;
  undefined8 extraout_RAX;
  undefined1 uVar20;
  TaggedStringPtr TVar21;
  char *pcVar22;
  FieldOptions *pFVar23;
  int64_t iVar24;
  uint uVar25;
  FieldDescriptor *unaff_RBX;
  Proto *unaff_RBP;
  undefined7 in_register_00000081;
  TaggedStringPtr TVar26;
  TaggedStringPtr unaff_R12;
  MaybeInitializedPtr MVar27;
  long lVar28;
  TaggedStringPtr TVar29;
  TaggedStringPtr unaff_R15;
  char *pcVar30;
  float fVar31;
  optional<google::protobuf::internal::DescriptorNames> oVar32;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  string_view element_name;
  string_view name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view element_name_07;
  string_view element_name_08;
  string_view full_name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_01;
  string_view element_name_09;
  string_view element_name_10;
  string_view element_name_11;
  string_view element_name_12;
  string_view input;
  string_view input_00;
  string_view input_01;
  initializer_list<unsigned_long> sizes;
  string_view name_00;
  string_view full_name_00;
  initializer_list<unsigned_long> sizes_00;
  initializer_list<unsigned_long> sizes_01;
  string_view option_name;
  string_view name_01;
  string_view source;
  string camelcase_name;
  string lowercase_name;
  string json_name;
  char *end_pos;
  string value;
  undefined1 local_210 [56];
  string local_1d8;
  MaybeInitializedPtr local_1b8;
  ArenaStringPtr local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [2];
  MaybeInitializedPtr local_188;
  FieldOptions *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  Proto *local_168;
  VoidPtr local_160;
  code *pcStack_158;
  VoidPtr local_150;
  code *pcStack_148;
  VoidPtr local_140;
  code *pcStack_138;
  VoidPtr local_130;
  code *pcStack_128;
  VoidPtr local_120;
  code *pcStack_118;
  HeapOrSoo local_110;
  _anonymous_namespace_ *local_100;
  TaggedStringPtr local_f8;
  _anonymous_namespace_ *local_f0;
  FieldOptions *local_e8;
  _anonymous_namespace_ *local_e0;
  FieldOptions *local_d8;
  HeapOrSoo local_d0;
  undefined1 local_c0 [8];
  char *pcStack_b8;
  undefined1 local_b0 [80];
  ulong local_60;
  char *local_58;
  FieldOptions *local_50;
  MaybeInitializedPtr local_48;
  string_view local_40;
  ulong uVar17;
  AlphaNum *c;
  
  TVar26.ptr_._1_7_ = in_register_00000081;
  TVar26.ptr_._0_1_ = is_extension;
  if (parent == (Descriptor *)0x0) {
    pMVar3 = (MaybeInitializedPtr *)this->file_->package_;
    local_210._16_8_ = *pMVar3;
    TVar21.ptr_ = pMVar3[1].p;
  }
  else {
    pcVar30 = (parent->all_names_).payload_;
    TVar21.ptr_._2_6_ = 0;
    TVar21.ptr_._0_2_ = *(ushort *)(pcVar30 + 2);
    local_210._16_8_ = pcVar30 + ~(ulong)TVar21.ptr_;
  }
  TVar29.ptr_ = (Proto *)0x0;
  if ((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x10) !=
      (undefined1  [80])0x0) {
    TVar29.ptr_ = (Proto *)((ulong)(proto->field_0)._impl_.json_name_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc);
  }
  local_210._0_8_ = result;
  local_210._8_8_ = parent;
  local_210._32_8_ = TVar26.ptr_;
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    BuildFieldOrExtension((DescriptorBuilder *)&local_d0.heap);
    uVar20 = SUB81(TVar21.ptr_,0);
    bVar11 = extraout_AL;
LAB_00165989:
    pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)uVar20,0xbf < bVar11,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
LAB_00164f99:
    if (pcVar19 == (Nonnull<const_char_*>)0x0) {
      if ((unaff_RBX->field_0x1 & 0x20) != 0) {
        pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_02._M_len = (ulong)*(ushort *)(pcVar30 + 2);
        element_name_02._M_str = pcVar30 + ~element_name_02._M_len;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_02,&unaff_RBP->super_Message,
                 DEFAULT_VALUE,"Repeated fields can\'t have default values.");
      }
      goto LAB_00164fd6;
    }
    BuildFieldOrExtension();
    goto LAB_001659ee;
  }
  puVar14 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  MVar4.p = (void *)*puVar14;
  this_00.ptr_ = (void *)puVar14[1];
  pcVar30 = "";
  if (TVar21.ptr_ != (void *)0x0) {
    pcVar30 = ".";
  }
  uVar17 = CONCAT71(0,TVar21.ptr_ != (void *)0x0);
  MVar27.p = (_anonymous_namespace_ *)((long)TVar21.ptr_ + (long)this_00.ptr_) + uVar17;
  local_210._24_8_ = alloc;
  local_210._40_8_ = TVar21.ptr_;
  local_210._48_8_ = this;
  local_168 = proto;
  local_110.heap.control = (ctrl_t *)this_00.ptr_;
  local_110.heap.slot_array = (MaybeInitializedPtr)MVar27.p;
  if ((Proto *)TVar29.ptr_ == (Proto *)0x0) {
    if (((FieldOptions *)this_00.ptr_ == (FieldOptions *)0x0) ||
       (iVar13 = 2, (byte)(*MVar4.p + 0x9fU) < 0x1a)) {
      if ((FieldOptions *)this_00.ptr_ == (FieldOptions *)0x0) {
        iVar13 = 0;
      }
      else {
        pFVar23 = (FieldOptions *)0x0;
        iVar13 = 0;
        do {
          cVar1 = *(char *)((long)&(pFVar23->super_Message).super_MessageLite._vptr_MessageLite +
                           (long)MVar4.p);
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            iVar13 = 2;
            break;
          }
          if (cVar1 == '_') {
            iVar13 = 1;
          }
          pFVar23 = (FieldOptions *)
                    ((long)&(pFVar23->super_Message).super_MessageLite._vptr_MessageLite + 1);
        } while ((FieldOptions *)this_00.ptr_ != pFVar23);
      }
    }
    local_f8.ptr_ = this_00.ptr_;
    if (iVar13 == 1) {
      input_01._M_str = (char *)0x1;
      input_01._M_len = (size_t)MVar4.p;
      (anonymous_namespace)::ToCamelCase_abi_cxx11_
                ((string *)&local_1b8,(_anonymous_namespace_ *)this_00.ptr_,input_01,is_extension);
      alloc = (FlatAllocator *)local_210._24_8_;
      local_d0.heap.control = (ctrl_t *)local_1b0.tagged_ptr_.ptr_;
      local_d0.heap.slot_array.p = local_1b8;
      _local_c0 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocatePlaceholderNames::kNullChar;
      local_b0._0_8_ = local_210._40_8_;
      local_b0._8_8_ = local_210._16_8_;
      local_b0._24_8_ = pcVar30;
      local_b0._16_8_ = uVar17;
      local_b0._48_8_ =
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocatePlaceholderNames::kNullChar._M_len;
      local_b0._56_8_ =
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocatePlaceholderNames::kNullChar._M_str;
      local_100 = (_anonymous_namespace_ *)((long)this_00.ptr_ + 1);
      local_f0 = (_anonymous_namespace_ *)((long)MVar27.p + 2) + (long)local_1b0.tagged_ptr_.ptr_;
      local_e8 = (FieldOptions *)local_1b0.tagged_ptr_.ptr_;
      local_d8 = (FieldOptions *)local_1b0.tagged_ptr_.ptr_;
      bytes_01._M_len = 6;
      bytes_01._M_array = (iterator)&local_d0;
      sizes_01._M_len = 8;
      sizes_01._M_array = (iterator)&local_110;
      c = (AlphaNum *)0x8;
      local_e0 = local_f0;
      local_b0._32_8_ = this_00.ptr_;
      local_b0._40_8_ = MVar4.p;
      oVar32 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::CreateDescriptorNames
                         ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           *)local_210._24_8_,bytes_01,sizes_01);
      _Var15 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _M_payload;
      uVar25 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _8_4_;
      TVar29.ptr_ = (void *)local_210._32_8_;
      unaff_R15.ptr_ = (void *)local_210._48_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.p != local_1a8) goto LAB_00164c92;
    }
    else {
      if (iVar13 != 0) goto LAB_00164a83;
      local_d0.heap.slot_array.p = (MaybeInitializedPtr)local_210._16_8_;
      pcStack_b8 = pcVar30;
      local_c0 = (undefined1  [8])uVar17;
      local_b0._16_16_ =
           (undefined1  [16])
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocatePlaceholderNames::kNullChar;
      local_100 = (_anonymous_namespace_ *)((long)this_00.ptr_ + 1);
      bytes_00._M_len = 4;
      bytes_00._M_array = (iterator)&local_d0;
      sizes_00._M_len = 8;
      sizes_00._M_array = (iterator)&local_110;
      c = (AlphaNum *)0x8;
      local_f0 = local_100;
      local_e8 = (FieldOptions *)this_00.ptr_;
      local_e0 = local_100;
      local_d8 = (FieldOptions *)this_00.ptr_;
      local_d0.heap.control = (ctrl_t *)TVar21.ptr_;
      local_b0._0_8_ = this_00.ptr_;
      local_b0._8_8_ = MVar4.p;
      oVar32 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::CreateDescriptorNames
                         (&alloc->
                           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          ,bytes_00,sizes_00);
      _Var15 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _M_payload;
      uVar25 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _8_4_;
      TVar29.ptr_ = (void *)local_210._32_8_;
      unaff_R15.ptr_ = (void *)local_210._48_8_;
    }
  }
  else {
LAB_00164a83:
    local_1b8.p = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,MVar4.p,
               (_anonymous_namespace_ *)((long)MVar4.p + (long)this_00.ptr_));
    uVar20 = SUB81(TVar26.ptr_,0);
    absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&local_1b8);
    input._M_str = (char *)0x1;
    input._M_len = (size_t)MVar4.p;
    pcVar22 = (char *)0x1;
    (anonymous_namespace)::ToCamelCase_abi_cxx11_
              ((string *)(local_210 + 0x38),(_anonymous_namespace_ *)this_00.ptr_,input,(bool)uVar20
              );
    if ((Proto *)TVar29.ptr_ == (Proto *)0x0) {
      input_00._M_str = pcVar22;
      input_00._M_len = (size_t)MVar4.p;
      (anonymous_namespace)::ToJsonName_abi_cxx11_
                ((string *)&local_188,(_anonymous_namespace_ *)this_00.ptr_,input_00);
    }
    else {
      local_188.p = &local_178;
      pp_Var5 = (((Proto *)TVar29.ptr_)->super_Message).super_MessageLite._vptr_MessageLite;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pp_Var5,
                 (((Proto *)TVar29.ptr_)->super_Message).super_MessageLite._internal_metadata_.ptr_
                 + (long)pp_Var5);
    }
    TVar29.ptr_ = (void *)local_210._32_8_;
    alloc = (FlatAllocator *)local_210._24_8_;
    local_d0.heap.control = (ctrl_t *)local_180;
    local_d0.heap.slot_array.p = local_188;
    _local_c0 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocatePlaceholderNames::kNullChar;
    local_b0._0_8_ = local_1d8._M_string_length;
    local_b0._8_8_ = local_1d8._M_dataplus._M_p;
    local_b0._16_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_len;
    local_b0._24_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_str;
    local_b0._32_8_ = local_1b0.tagged_ptr_.ptr_;
    local_b0._40_8_ = local_1b8;
    local_b0._48_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_len;
    local_b0._56_8_ =
         anon_unknown_24::
         FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         ::AllocatePlaceholderNames::kNullChar._M_str;
    local_b0._64_8_ = local_210._40_8_;
    local_b0._72_8_ = local_210._16_8_;
    local_40 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    local_100 = (_anonymous_namespace_ *)((long)MVar27.p + (long)local_1b0.tagged_ptr_.ptr_) + 2;
    local_f8 = local_1b0.tagged_ptr_.ptr_;
    local_f0 = (_anonymous_namespace_ *)
               ((undefined1 *)
                ((long)&(((Message *)local_1d8._M_string_length)->super_MessageLite).
                        _vptr_MessageLite + 3) + (long)MVar27.p + (long)local_1b0.tagged_ptr_.ptr_);
    local_e8 = (FieldOptions *)local_1d8._M_string_length;
    local_e0 = (_anonymous_namespace_ *)((long)MVar27.p + (long)local_1b0.tagged_ptr_.ptr_) +
               (long)(Message *)local_1d8._M_string_length + 4 + (long)&local_180->super_Message;
    local_d8 = local_180;
    bytes._M_len = 10;
    bytes._M_array = (iterator)&local_d0;
    sizes._M_len = 8;
    sizes._M_array = (iterator)&local_110;
    c = (AlphaNum *)0x8;
    local_60 = uVar17;
    local_58 = pcVar30;
    local_50 = (FieldOptions *)this_00.ptr_;
    local_48.p = MVar4.p;
    oVar32 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::CreateDescriptorNames
                       ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         *)local_210._24_8_,bytes,sizes);
    unaff_R15.ptr_ = (void *)local_210._48_8_;
    _Var15 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
    uVar25 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.p != &local_178) {
      operator_delete(local_188.p,local_178._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.p != local_1a8) {
LAB_00164c92:
      operator_delete(local_1b8.p,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  unaff_RBP = local_168;
  if ((uVar25 & 1) == 0) {
    if ((TaggedStringPtr)local_210._40_8_ == (TaggedStringPtr)0x0) {
      plVar16 = (long *)((ulong)(local_168->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      lVar28 = *plVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_210 + 0x38),lVar28,plVar16[1] + lVar28);
    }
    else {
      local_d0.heap.control = (ctrl_t *)local_210._40_8_;
      local_d0.heap.slot_array = (MaybeInitializedPtr)local_210._16_8_;
      local_110.heap.control = (ctrl_t *)0x1;
      local_110.heap.slot_array =
           (MaybeInitializedPtr)
           ((long)
            "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
           + 0x77);
      puVar14 = (undefined8 *)
                ((ulong)(local_168->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      local_1b0.tagged_ptr_.ptr_ = (TaggedStringPtr)*puVar14;
      local_1b8 = *(MaybeInitializedPtr *)(puVar14 + 1);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_210 + 0x38),(lts_20250127 *)&local_d0.heap,
                 (AlphaNum *)&local_110.heap,(AlphaNum *)&local_1b8,c);
    }
    element_name._M_str = local_1d8._M_dataplus._M_p;
    element_name._M_len = local_1d8._M_string_length;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name,&unaff_RBP->super_Message,NAME,
             "Name too long.");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    name_00._M_str = "unknown";
    name_00._M_len = 7;
    oVar32 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::AllocateEntityNames
                       (&alloc->
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                        ,(string_view)(ZEXT816(0x3a5a94) << 0x40),name_00);
    _Var15 = oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
    if (((undefined1  [16])
         oVar32.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  ((DescriptorNames *)(local_210._0_8_ + 8))->payload_ = (char *)_Var15;
  puVar14 = (undefined8 *)
            ((ulong)(unaff_RBP->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
  full_name_00._M_len = (ulong)*(ushort *)(pcVar30 + 2);
  full_name_00._M_str = pcVar30 + ~full_name_00._M_len;
  name._M_str = (char *)*puVar14;
  name._M_len = puVar14[1];
  ValidateSymbolName((DescriptorBuilder *)unaff_R15.ptr_,name,full_name_00,&unaff_RBP->super_Message
                    );
  *(FileDescriptor **)(local_210._0_8_ + 0x10) = *(FileDescriptor **)((long)unaff_R15.ptr_ + 0xb8);
  *(int32_t *)(local_210._0_8_ + 4) = (unaff_RBP->field_0)._impl_.number_;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xf7 | (char)TVar29.ptr_ * '\b';
  *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) & 0xef;
  *(undefined1 *)(local_210._0_8_ + 3) = *(undefined1 *)(local_210._0_8_ + 3) & 0xfe;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xfd |
       (unaff_RBP->field_0)._impl_.proto3_optional_ * '\x02';
  *(undefined1 *)(local_210._0_8_ + 3) = *(undefined1 *)(local_210._0_8_ + 3) | 6;
  if (((unaff_RBP->field_0)._impl_.proto3_optional_ == true) &&
     ((*(FileDescriptor **)((long)unaff_R15.ptr_ + 0xb8))->edition_ != EDITION_PROTO3)) {
    local_d0.heap.control = local_210;
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_00._M_str = pcVar30 + ~element_name_00._M_len;
    local_120.obj = &local_d0;
    pcStack_118 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_120.obj;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_00,&unaff_RBP->super_Message,TYPE,
             make_error);
  }
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xfb | *(byte *)&unaff_RBP->field_0 >> 2 & 4;
  *(uint8_t *)(local_210._0_8_ + 2) = *(uint8_t *)((long)&unaff_RBP->field_0 + 0x48);
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0x3f |
       *(char *)((long)&unaff_RBP->field_0 + 0x44) << 6;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xdf |
       (0xbf < (byte)*(undefined1 *)(local_210._0_8_ + 1)) << 5;
  if ((*(undefined1 *)(local_210._0_8_ + 1) & 200) == 0x88) {
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_01._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_01._M_str = pcVar30 + ~element_name_01._M_len;
    local_d0.heap.control = local_210;
    local_130.obj = &local_d0;
    pcStack_128 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = local_130.obj;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_01,&unaff_RBP->super_Message,TYPE,
             make_error_00);
  }
  ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
  default_value_int64_t_ = 0;
  *(once_flag **)(local_210._0_8_ + 0x18) = (once_flag *)0x0;
  *(Descriptor **)(local_210._0_8_ + 0x20) = (Descriptor *)0x0;
  *(byte *)(local_210._0_8_ + 1) =
       *(undefined1 *)(local_210._0_8_ + 1) & 0xfe | *(byte *)&unaff_RBP->field_0 >> 3 & 1;
  unaff_R12.ptr_ = alloc;
  if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x8) !=
      (undefined1  [80])0x0) {
    bVar11 = *(undefined1 *)(local_210._0_8_ + 1);
    uVar20 = (bVar11 & 0x20) >> 5;
    unaff_RBX = (FieldDescriptor *)local_210._0_8_;
    if (0xbf < bVar11 != (bool)uVar20) goto LAB_00165989;
    pcVar19 = (Nonnull<const_char_*>)0x0;
    goto LAB_00164f99;
  }
LAB_00164fd6:
  if ((*(uint *)&unaff_RBP->field_0 >> 10 & 1) == 0) goto switchD_001650d8_default;
  if ((*(uint *)&unaff_RBP->field_0 & 8) == 0) {
    switch(*(undefined4 *)
            (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)(local_210._0_8_ + 2) * 4)) {
    case 1:
    case 3:
    case 6:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int32_t_ = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int64_t_ = 0;
      break;
    case 7:
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_bool_ = false;
      break;
    case 9:
      if ((internal::init_protobuf_defaults_state & 1) == 0) {
        internal::InitProtobufDefaultsSlow();
      }
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_double_ = (double)&internal::fixed_address_empty_string;
      break;
    case 10:
      LOCK();
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int64_t_ = 0;
      UNLOCK();
    }
    goto switchD_001650d8_default;
  }
  local_110.heap.control = (ctrl_t *)0x0;
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint8_t *)(local_210._0_8_ + 2) * 4)) {
  case 1:
    lVar28 = strtol(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc),(char **)&local_110,0);
    iVar12 = (int32_t)lVar28;
    goto LAB_00165640;
  case 2:
    psVar18 = (string *)
              strtoll(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                & 0xfffffffffffffffc),(char **)&local_110,0);
    goto LAB_0016581f;
  case 3:
    uVar17 = strtoul(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                               0xfffffffffffffffc),(char **)&local_110,0);
    iVar12 = (int32_t)uVar17;
LAB_00165640:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int32_t_ = iVar12;
    break;
  case 4:
    psVar18 = (string *)
              strtoull(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                 & 0xfffffffffffffffc),(char **)&local_110,0);
LAB_0016581f:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_string_ = psVar18;
    break;
  case 5:
    iVar13 = std::__cxx11::string::compare
                       ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                & 0xfffffffffffffffc));
    if (iVar13 == 0) {
      iVar24 = 0x7ff0000000000000;
    }
    else {
      iVar13 = std::__cxx11::string::compare
                         ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                          ptr_ & 0xfffffffffffffffc));
      if (iVar13 == 0) {
        iVar24 = -0x10000000000000;
      }
      else {
        iVar13 = std::__cxx11::string::compare
                           ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                            ptr_ & 0xfffffffffffffffc));
        if (iVar13 != 0) {
          dVar7 = io::NoLocaleStrtod(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.
                                                       tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                                     (char **)&local_110);
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_double_ = dVar7;
          break;
        }
        iVar24 = 0x7ff8000000000000;
      }
    }
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = iVar24;
    break;
  case 6:
    iVar13 = std::__cxx11::string::compare
                       ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                & 0xfffffffffffffffc));
    if (iVar13 == 0) {
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_int32_t_ = 0x7f800000;
    }
    else {
      iVar13 = std::__cxx11::string::compare
                         ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                          ptr_ & 0xfffffffffffffffc));
      if (iVar13 == 0) {
        ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
        default_value_int32_t_ = -0x800000;
      }
      else {
        iVar13 = std::__cxx11::string::compare
                           ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                            ptr_ & 0xfffffffffffffffc));
        if (iVar13 == 0) {
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_int32_t_ = 0x7fc00000;
        }
        else {
          dVar7 = io::NoLocaleStrtod(*(char **)((ulong)(unaff_RBP->field_0)._impl_.default_value_.
                                                       tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                                     (char **)&local_110);
          fVar31 = io::SafeDoubleToFloat(dVar7);
          ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
          default_value_float_ = fVar31;
        }
      }
    }
    break;
  case 7:
    iVar13 = std::__cxx11::string::compare
                       ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_
                                & 0xfffffffffffffffc));
    if (iVar13 == 0) {
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_bool_ = true;
    }
    else {
      iVar13 = std::__cxx11::string::compare
                         ((char *)((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.
                                          ptr_ & 0xfffffffffffffffc));
      if (iVar13 == 0) {
        ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
        default_value_bool_ = false;
      }
      else {
        pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_10._M_len = (ulong)*(ushort *)(pcVar30 + 2);
        element_name_10._M_str = pcVar30 + ~element_name_10._M_len;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_10,&unaff_RBP->super_Message,
                 DEFAULT_VALUE,"Boolean default must be true or false.");
      }
    }
    break;
  case 8:
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = 0;
    break;
  case 9:
    if (*(uint8_t *)(local_210._0_8_ + 2) != 0xc) {
      psVar18 = (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string_const&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)unaff_R12.ptr_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                           0xfffffffffffffffc));
      goto LAB_0016581f;
    }
    local_d0.heap.slot_array.p = (MaybeInitializedPtr)0x0;
    auVar8[0xf] = 0;
    auVar8._0_15_ = stack0xffffffffffffff41;
    _local_c0 = (string_view)(auVar8 << 8);
    puVar14 = (undefined8 *)
              ((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
              0xfffffffffffffffc);
    source._M_str = (char *)*puVar14;
    source._M_len = puVar14[1];
    local_d0.heap.control = (ctrl_t *)(Proto *)local_c0;
    bVar10 = absl::lts_20250127::CUnescape
                       (source,(Nonnull<std::string_*>)&local_d0.heap,(Nullable<std::string_*>)0x0);
    if (bVar10) {
      psVar18 = (anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)unaff_R12.ptr_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_d0.heap);
      ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
      default_value_string_ = psVar18;
    }
    else {
      pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_11._M_len = (ulong)*(ushort *)(pcVar30 + 2);
      element_name_11._M_str = pcVar30 + ~element_name_11._M_len;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_11,&unaff_RBP->super_Message,
               DEFAULT_VALUE,"Invalid escaping in default value.");
    }
    if ((Proto *)local_d0.heap.control != (Proto *)local_c0) {
      operator_delete(local_d0.heap.control,(long)local_c0 + 1);
    }
    break;
  case 10:
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_09._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_09._M_str = pcVar30 + ~element_name_09._M_len;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_09,&unaff_RBP->super_Message,
             DEFAULT_VALUE,"Messages can\'t have default values.");
    *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) & 0xfe;
    LOCK();
    ((anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)(local_210._0_8_ + 0x50))->
    default_value_int64_t_ = 0;
    UNLOCK();
  }
  if (((Proto *)local_110.heap.control != (Proto *)0x0) &&
     ((*(long *)(((ulong)(unaff_RBP->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                 0xfffffffffffffffc) + 8) == 0 ||
      ((_anonymous_namespace_)*local_110.heap.control != (_anonymous_namespace_)0x0)))) {
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_12._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_12._M_str = pcVar30 + ~element_name_12._M_len;
    local_140.obj = &local_d0;
    pcStack_138 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_03.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_03.ptr_.obj = local_140.obj;
    local_d0.heap.control = (ctrl_t *)unaff_RBP;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_12,&unaff_RBP->super_Message,
             DEFAULT_VALUE,make_error_03);
  }
switchD_001650d8_default:
  if (*(int *)(local_210._0_8_ + 4) < 1) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
    ::try_emplace_impl<google::protobuf::Descriptor*const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                *)&local_d0.heap,&((DescriptorBuilder *)unaff_R15.ptr_)->message_hints_,
               (Descriptor **)(local_210 + 8));
    uVar9 = local_d0.heap.slot_array;
    iVar13 = -1;
    if (-1 < *(int *)((long)local_d0.heap.slot_array + 8)) {
      iVar13 = *(int *)((long)local_d0.heap.slot_array + 8);
    }
    uVar25 = iVar13 + 1;
    if (0x1ffffffe < uVar25) {
      uVar25 = 0x1fffffff;
    }
    *(uint *)((long)local_d0.heap.slot_array + 8) = uVar25;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(uVar9 + 0x10))->_M_allocated_capacity == 0) {
      *(Proto **)(uVar9 + 0x10) = unaff_RBP;
      pcVar30 = (char *)(uVar9 + 0x18);
      pcVar30[0] = '\x01';
      pcVar30[1] = '\0';
      pcVar30[2] = '\0';
      pcVar30[3] = '\0';
    }
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_04._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_04._M_str = pcVar30 + ~element_name_04._M_len;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_04,&unaff_RBP->super_Message,NUMBER,
             "Field numbers must be positive integers.");
    unaff_R12.ptr_ = (void *)local_210._24_8_;
LAB_00165169:
    if ((char)TVar29.ptr_ == '\0') {
      if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x2) !=
          (undefined1  [80])0x0) {
        pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_07._M_len = (ulong)*(ushort *)(pcVar30 + 2);
        element_name_07._M_str = pcVar30 + ~element_name_07._M_len;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_07,&unaff_RBP->super_Message,
                 EXTENDEE,"FieldDescriptorProto.extendee set for non-extension field.");
      }
      uVar9 = local_210._8_8_;
      *(undefined8 *)(local_210._0_8_ + 0x20) = local_210._8_8_;
      if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x80) !=
          (undefined1  [80])0x0) {
        iVar13 = (unaff_RBP->field_0)._impl_.oneof_index_;
        if ((-1 < iVar13) && (iVar13 < *(int *)(local_210._8_8_ + 0x80))) {
          *(undefined1 *)(local_210._0_8_ + 1) = *(undefined1 *)(local_210._0_8_ + 1) | 0x10;
          iVar13 = (unaff_RBP->field_0)._impl_.oneof_index_;
          lVar28 = (long)iVar13;
          if (lVar28 < 0) {
            pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (0,lVar28,"0 <= index");
          }
          else {
            pcVar19 = (Nonnull<const_char_*>)0x0;
          }
          if (pcVar19 == (Nonnull<const_char_*>)0x0) {
            iVar2 = *(int *)(uVar9 + 0x80);
            if (iVar13 < iVar2) {
              pcVar19 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar28,(long)iVar2,"index < oneof_decl_count()");
            }
            if (pcVar19 == (Nonnull<const_char_*>)0x0) {
              ((anon_union_8_2_2904990b_for_scope_ *)(local_210._0_8_ + 0x28))->containing_oneof =
                   *(OneofDescriptor **)(uVar9 + 0x48) + lVar28;
              *(byte *)(local_210._0_8_ + 3) =
                   (*(undefined1 *)(local_210._0_8_ + 3) & 0xfe |
                   (byte)*(undefined1 *)(local_210._0_8_ + 1) >> 1 & 1) ^ 1;
              unaff_R12.ptr_ = (void *)local_210._24_8_;
              goto LAB_00165369;
            }
          }
          else {
LAB_001659ee:
            BuildFieldOrExtension();
          }
          BuildFieldOrExtension();
          if (local_d0.heap.control != (ctrl_t *)TVar29.ptr_) {
            operator_delete(local_d0.heap.control,(long)local_c0 + 1);
          }
          _Unwind_Resume(extraout_RAX);
        }
        pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
        element_name_08._M_len = (ulong)*(ushort *)(pcVar30 + 2);
        element_name_08._M_str = pcVar30 + ~element_name_08._M_len;
        local_160.obj = &local_d0;
        local_d0.heap.slot_array = (MaybeInitializedPtr)(local_210 + 8);
        pcStack_158 = absl::lts_20250127::functional_internal::
                      InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
        ;
        make_error_02.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
        ;
        make_error_02.ptr_.obj = local_160.obj;
        local_d0.heap.control = (ctrl_t *)unaff_RBP;
        AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_08,&unaff_RBP->super_Message,TYPE,
                 make_error_02);
      }
      goto LAB_00165369;
    }
  }
  else if ((char)TVar29.ptr_ == '\0') {
    if (0x1fffffff < *(int *)(local_210._0_8_ + 4)) {
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
      ::try_emplace_impl<google::protobuf::Descriptor*const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                  *)&local_d0,&((DescriptorBuilder *)unaff_R15.ptr_)->message_hints_,
                 (Descriptor **)(local_210 + 8));
      uVar9 = local_d0.heap.slot_array;
      iVar13 = -1;
      if (-1 < *(int *)((long)local_d0.heap.slot_array + 8)) {
        iVar13 = *(int *)((long)local_d0.heap.slot_array + 8);
      }
      uVar25 = iVar13 + 1;
      if (0x1ffffffe < uVar25) {
        uVar25 = 0x1fffffff;
      }
      *(uint *)((long)local_d0.heap.slot_array + 8) = uVar25;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar9 + 0x10))->_M_allocated_capacity == 0) {
        *(Proto **)(uVar9 + 0x10) = unaff_RBP;
        pcVar30 = (char *)(uVar9 + 0x18);
        pcVar30[0] = '\x01';
        pcVar30[1] = '\0';
        pcVar30[2] = '\0';
        pcVar30[3] = '\0';
      }
      pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
      element_name_03._M_len = (ulong)*(ushort *)(pcVar30 + 2);
      element_name_03._M_str = pcVar30 + ~element_name_03._M_len;
      pcStack_148 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
      ;
      make_error_01.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
      ;
      make_error_01.ptr_.obj = &local_d0;
      local_150.obj = &local_d0;
      AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_03,&unaff_RBP->super_Message,NUMBER,
               make_error_01);
    }
    goto LAB_00165169;
  }
  if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x2) ==
      (undefined1  [80])0x0) {
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_05._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_05._M_str = pcVar30 + ~element_name_05._M_len;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_05,&unaff_RBP->super_Message,EXTENDEE,
             "FieldDescriptorProto.extendee not set for extension field.");
  }
  ((anon_union_8_2_2904990b_for_scope_ *)(local_210._0_8_ + 0x28))->extension_scope =
       (Descriptor *)local_210._8_8_;
  if ((undefined1  [80])((undefined1  [80])unaff_RBP->field_0 & (undefined1  [80])0x80) !=
      (undefined1  [80])0x0) {
    pcVar30 = ((DescriptorNames *)(local_210._0_8_ + 8))->payload_;
    element_name_06._M_len = (ulong)*(ushort *)(pcVar30 + 2);
    element_name_06._M_str = pcVar30 + ~element_name_06._M_len;
    AddError((DescriptorBuilder *)unaff_R15.ptr_,element_name_06,&unaff_RBP->super_Message,TYPE,
             "FieldDescriptorProto.oneof_index should not be set for extensions.");
  }
LAB_00165369:
  option_name._M_str = "google.protobuf.FieldOptions";
  option_name._M_len = 0x1c;
  AllocateOptions<google::protobuf::FieldDescriptor>
            ((DescriptorBuilder *)unaff_R15.ptr_,unaff_RBP,(FieldDescriptor *)local_210._0_8_,8,
             option_name,(FlatAllocator *)unaff_R12.ptr_);
  puVar6 = *(ushort **)(local_210._0_8_ + 8);
  full_name._M_len = (ulong)puVar6[1];
  full_name._M_str = (char *)(~full_name._M_len + (long)puVar6);
  name_01._M_len = (ulong)*puVar6;
  name_01._M_str = (char *)(~name_01._M_len + (long)puVar6);
  *(uint8_t *)local_210._0_8_ = '\x02';
  AddSymbol((DescriptorBuilder *)unaff_R15.ptr_,full_name,(void *)local_210._8_8_,name_01,
            &unaff_RBP->super_Message,(Symbol)local_210._0_8_);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension,
                                              internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  // We allocate all names in a single array, and dedup them.
  if (auto names = alloc.AllocateFieldNames(
          proto.name(), scope,
          proto.has_json_name() ? &proto.json_name() : nullptr)) {
    result->all_names_ = *names;
  } else {
    AddError(
        scope.empty() ? proto.name() : absl::StrCat(scope, ".", proto.name()),
        proto, DescriptorPool::ErrorCollector::NAME, "Name too long.");
    result->all_names_ = alloc.AllocateEntityNames("", "unknown").value();
  }

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;
  result->is_oneof_ = false;
  result->in_real_oneof_ = false;
  result->proto3_optional_ = proto.proto3_optional();
  result->legacy_proto_ctype_ = FieldOptions::CType_MAX + 1;

  if (proto.proto3_optional() && file_->edition() != Edition::EDITION_PROTO3) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             [&] {
               return absl::StrCat(
                   "The [proto3_optional=true] option may only be set on proto3"
                   "fields, not ",
                   result->full_name());
             });
  }

  result->has_json_name_ = proto.has_json_name();

  result->type_ = proto.type();
  result->label_ = proto.label();
  result->is_repeated_ = result->label_ == FieldDescriptor::LABEL_REPEATED;

  if (result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    // An extension cannot have a required field (b/13365836).
    if (result->is_extension_) {
      AddError(result->full_name(), proto,
               // Error location `TYPE`: we would really like to indicate
               // `LABEL`, but the `ErrorLocation` enum has no entry for this,
               // and we don't necessarily know about all implementations of the
               // `ErrorCollector` interface to extend them to handle the new
               // error location type properly.
               DescriptorPool::ErrorCollector::TYPE, [&] {
                 return absl::StrCat("The extension ", result->full_name(),
                                     " cannot be required.");
               });
    }
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ =
              std::strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          static_assert(sizeof(int64_t) == sizeof(long long),  // NOLINT
                        "sizeof int64_t is not sizeof long long");
          result->default_value_int64_t_ =
              std::strtoll(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ =
              std::strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          static_assert(
              sizeof(uint64_t) == sizeof(unsigned long long),  // NOLINT
              "sizeof uint64_t is not sizeof unsigned long long");
          result->default_value_uint64_t_ =
              std::strtoull(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            std::string value;
            if (absl::CUnescape(proto.default_value(), &value)) {
              result->default_value_string_ = alloc.AllocateStrings(value);
            } else {
              AddError(result->full_name(), proto,
                       DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                       "Invalid escaping in default value.");
            }
          } else {
            result->default_value_string_ =
                alloc.AllocateStrings(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          result->default_generated_instance_ = nullptr;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                     return absl::StrCat("Couldn't parse default value \"",
                                         proto.default_value(), "\".");
                   });
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          result->default_generated_instance_ = nullptr;
          break;
      }
    }
  }

  if (result->number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             [&] {
               return absl::Substitute(
                   "Field numbers cannot be greater than $0.",
                   FieldDescriptor::kMaxNumber);
             });
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->scope_.extension_scope = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::Substitute(
                       "FieldDescriptorProto.oneof_index $0 is "
                       "out of range for type \"$1\".",
                       proto.oneof_index(), parent->name());
                 });
      } else {
        result->is_oneof_ = true;
        result->scope_.containing_oneof =
            parent->oneof_decl(proto.oneof_index());
        result->in_real_oneof_ = !result->proto3_optional_;
      }
    }
  }

  // Copy options.
  AllocateOptions(proto, result, FieldDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.FieldOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}